

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O3

void __thiscall TasGrid::GridSequence::differentiate(GridSequence *this,double *x,double *jacobian)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  pointer pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  pointer pdVar10;
  double *pdVar11;
  int j;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  value_cache;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  derivative_cache;
  vector<double,_std::allocator<double>_> diff_values;
  allocator_type local_c9;
  double *local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  size_t local_a8;
  pointer local_a0;
  size_t local_98;
  long local_90;
  long local_88;
  pointer local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  local_c8 = jacobian;
  cacheBasisValues<double>(&local_78,this,x);
  cacheBasisDerivatives<double>(&local_60,this,x);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)(this->super_BaseCanonicalGrid).num_dimensions,&local_c9);
  uVar3 = (this->super_BaseCanonicalGrid).num_outputs;
  uVar4 = (this->super_BaseCanonicalGrid).num_dimensions;
  if (0 < (int)(uVar4 * uVar3)) {
    memset(local_c8,0,(ulong)(uVar4 * uVar3) << 3);
  }
  auVar8 = _DAT_001ca070;
  auVar7 = _DAT_001ca060;
  local_90 = (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  if (0 < local_90) {
    uVar13 = (ulong)uVar4;
    local_98 = (this->super_BaseCanonicalGrid).points.num_dimensions;
    local_c0 = (this->super_BaseCanonicalGrid).points.indexes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_a8 = (this->surpluses).stride;
    local_b0 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_80 = local_60.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = ((local_60.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    local_b8 = local_78.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar1 = uVar13 - 2;
    auVar15._8_4_ = (int)lVar1;
    auVar15._0_8_ = lVar1;
    auVar15._12_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar15 = auVar15 ^ _DAT_001ca060;
    lVar1 = 0;
    do {
      local_88 = lVar1;
      iVar5 = local_c0[local_98 * local_88];
      *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = local_a0[iVar5];
      if (1 < (int)uVar4) {
        dVar2 = ((local_78.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start[iVar5];
        uVar9 = 0;
        do {
          auVar16._8_4_ = (int)uVar9;
          auVar16._0_8_ = uVar9;
          auVar16._12_4_ = (int)(uVar9 >> 0x20);
          auVar16 = (auVar16 | auVar8) ^ auVar7;
          if ((bool)(~(auVar15._4_4_ < auVar16._4_4_ ||
                      auVar15._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar15._4_4_) & 1)) {
            local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9 + 1] = dVar2;
          }
          if (auVar16._12_4_ <= auVar15._12_4_ &&
              (auVar16._8_4_ <= auVar15._8_4_ || auVar16._12_4_ != auVar15._12_4_)) {
            local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9 + 2] = dVar2;
          }
          uVar9 = uVar9 + 2;
        } while ((uVar4 & 0x7ffffffe) != uVar9);
        if (1 < (int)uVar4) {
          pdVar10 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = uVar13;
          uVar14 = 1;
          do {
            iVar5 = local_c0[local_98 * local_88 + uVar14];
            pdVar6 = local_78.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = 0;
            do {
              local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] =
                   pdVar6[iVar5] *
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar14 != uVar12);
            local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] =
                 local_60.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[iVar5] *
                 local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
            uVar12 = uVar14 + 1;
            if ((long)uVar12 < (long)(int)uVar4) {
              pdVar6 = local_78.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar14 = 2;
              do {
                pdVar10[uVar14] = pdVar6[iVar5] * pdVar10[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar9 != uVar14);
            }
            pdVar10 = pdVar10 + 1;
            uVar9 = uVar9 - 1;
            uVar14 = uVar12;
          } while (uVar12 != uVar13);
        }
      }
      if (0 < (int)uVar3) {
        uVar9 = 0;
        pdVar11 = local_c8;
        do {
          if (0 < (int)uVar4) {
            uVar14 = 0;
            do {
              pdVar11[uVar14] =
                   local_b0[local_a8 * local_88 + uVar9] *
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14] + pdVar11[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
          }
          uVar9 = uVar9 + 1;
          pdVar11 = pdVar11 + uVar13;
        } while (uVar9 != uVar3);
      }
      lVar1 = local_88 + 1;
    } while (local_88 + 1 != local_90);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_60);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_78);
  return;
}

Assistant:

void GridSequence::differentiate(const double x[], double jacobian[]) const {
    // Based on the logic in the TasGrid::GridSequence::evaluate() and TasGrid::GridSequence::getDifferentiationWeights() functions.
    std::vector<std::vector<double>> value_cache = cacheBasisValues<double>(x);
    std::vector<std::vector<double>> derivative_cache = cacheBasisDerivatives<double>(x);
    std::vector<double> diff_values(num_dimensions);
    std::fill_n(jacobian, num_outputs * num_dimensions, 0.0);
    int n = points.getNumIndexes();
    for(int i=0; i<n; i++) {
        const int* p = points.getIndex(i);
        const double *s = surpluses.getStrip(i);

        diff_values[0] = derivative_cache[0][p[0]];
        for(int j=1; j<num_dimensions; j++) diff_values[j] = value_cache[0][p[0]];

        for(int k=1; k<num_dimensions; k++) {
            for(int j=0; j<k; j++) diff_values[j] *= value_cache[k][p[k]];
            diff_values[k] *= derivative_cache[k][p[k]];
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= value_cache[k][p[k]];
        }
        for(int k=0; k<num_outputs; k++)
            for(int j=0; j<num_dimensions; j++)
                jacobian[k * num_dimensions + j] += s[k] * diff_values[j];
    }
}